

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_tec_zone(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell,FILE *file)

{
  REF_EDGE pRVar1;
  REF_NODE pRVar2;
  REF_DBL *pRVar3;
  int iVar4;
  REF_INT RVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  pRVar1 = ref_subdiv->edge;
  pRVar2 = ref_subdiv->grid->node;
  iVar7 = 0;
  iVar4 = fprintf((FILE *)file,
                  "zone t=\"celledge\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)(uint)(ref_cell->edge_per * 2),(ulong)(uint)ref_cell->edge_per,"point",
                  "felineseg");
  if (0 < ref_cell->edge_per) {
    do {
      RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,iVar7,cell);
      lVar6 = (long)pRVar1->e2n[RVar5 * 2];
      pRVar3 = pRVar2->real;
      fprintf((FILE *)file," %.16e %.16e %.16e %d\n",pRVar3[lVar6 * 0xf],pRVar3[lVar6 * 0xf + 1],
              pRVar3[lVar6 * 0xf + 2],(ulong)(uint)ref_subdiv->mark[RVar5]);
      lVar6 = (long)pRVar1->e2n[RVar5 * 2 + 1];
      pRVar3 = pRVar2->real;
      iVar4 = fprintf((FILE *)file," %.16e %.16e %.16e %d\n",pRVar3[lVar6 * 0xf],
                      pRVar3[lVar6 * 0xf + 1],pRVar3[lVar6 * 0xf + 2],
                      (ulong)(uint)ref_subdiv->mark[RVar5]);
      iVar7 = iVar7 + 1;
    } while (iVar7 < ref_cell->edge_per);
  }
  if (0 < ref_cell->edge_per) {
    uVar8 = 1;
    iVar7 = 0;
    do {
      iVar4 = fprintf((FILE *)file," %d %d\n",(ulong)uVar8,(ulong)(uVar8 + 1));
      iVar7 = iVar7 + 1;
      uVar8 = uVar8 + 2;
    } while (iVar7 < ref_cell->edge_per);
  }
  return iVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_tec_zone(REF_SUBDIV ref_subdiv,
                                              REF_CELL ref_cell, REF_INT cell,
                                              FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_INT cell_edge, edge, node;

  fprintf(file,
          "zone t=\"celledge\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          2 * ref_cell_edge_per(ref_cell), ref_cell_edge_per(ref_cell), "point",
          "felineseg");

  for (cell_edge = 0; cell_edge < ref_cell_edge_per(ref_cell); cell_edge++) {
    edge = ref_subdiv_c2e(ref_subdiv, ref_cell, cell_edge, cell);
    node = ref_edge_e2n(ref_edge, 0, edge);
    fprintf(file, " %.16e %.16e %.16e %d\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            ref_subdiv_mark(ref_subdiv, edge));
    node = ref_edge_e2n(ref_edge, 1, edge);
    fprintf(file, " %.16e %.16e %.16e %d\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            ref_subdiv_mark(ref_subdiv, edge));
  }

  for (cell_edge = 0; cell_edge < ref_cell_edge_per(ref_cell); cell_edge++)
    fprintf(file, " %d %d\n", 1 + 2 * cell_edge, 2 + 2 * cell_edge);

  return REF_SUCCESS;
}